

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O2

void __thiscall
TEST_MemoryLeakDetectorTest_periodChecking_Test::testBody
          (TEST_MemoryLeakDetectorTest_periodChecking_Test *this)

{
  MemoryLeakDetector *pMVar1;
  TestMemoryAllocator *pTVar2;
  char *memory;
  UtestShell *pUVar3;
  size_t sVar4;
  TestTerminator *pTVar5;
  
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  pTVar2 = defaultMallocAllocator();
  memory = MemoryLeakDetector::allocMemory(pMVar1,pTVar2,2,false);
  pUVar3 = UtestShell::getCurrent();
  sVar4 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                     mem_leak_period_all);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,1,sVar4,"LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_all)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x1da,pTVar5);
  pUVar3 = UtestShell::getCurrent();
  sVar4 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                     mem_leak_period_disabled);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,0,sVar4,
             "LONGS_EQUAL(0, detector->totalMemoryLeaks(mem_leak_period_disabled)) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x1db,pTVar5);
  pUVar3 = UtestShell::getCurrent();
  sVar4 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                     mem_leak_period_enabled);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,1,sVar4,
             "LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_enabled)) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x1dc,pTVar5);
  pUVar3 = UtestShell::getCurrent();
  sVar4 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                     mem_leak_period_checking);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,1,sVar4,
             "LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_checking)) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x1dd,pTVar5);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  pTVar2 = defaultMallocAllocator();
  MemoryLeakDetector::deallocMemory(pMVar1,pTVar2,memory,false);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, periodChecking)
{
    char* mem = detector->allocMemory(defaultMallocAllocator(), 2);
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_all));
    LONGS_EQUAL(0, detector->totalMemoryLeaks(mem_leak_period_disabled));
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_enabled));
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_checking));
    detector->deallocMemory(defaultMallocAllocator(), mem);
}